

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundFunction.cpp
# Opt level: O2

BoundFunction *
Js::BoundFunction::InflateBoundFunction
          (ScriptContext *ctx,RecyclableObject *function,Var bThis,uint32 ct,Type *args)

{
  Recycler *alloc;
  BoundFunction *this;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  local_60 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_5de7879;
  data.filename._0_4_ = 0x193;
  data._32_8_ = args;
  alloc = Memory::Recycler::TrackAllocInfo(ctx->recycler,(TrackAllocData *)local_60);
  this = (BoundFunction *)new<Memory::Recycler>(0x50,alloc,0x37a1d4);
  BoundFunction(this,(((ctx->super_ScriptContextBase).javascriptLibrary)->boundFunctionType).ptr);
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->boundThis,bThis);
  this->count = ct;
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierSet
            (&this->boundArgs,(WriteBarrierPtr<void> *)data._32_8_);
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierSet(&this->targetFunction,function);
  return this;
}

Assistant:

BoundFunction* BoundFunction::InflateBoundFunction(
        ScriptContext* ctx, RecyclableObject* function, Var bThis, uint32 ct, Field(Var)* args)
    {
        BoundFunction* res = RecyclerNew(ctx->GetRecycler(), BoundFunction, ctx->GetLibrary()->GetBoundFunctionType());

        res->boundThis = bThis;
        res->count = ct;
        res->boundArgs = args;

        res->targetFunction = function;

        return res;
    }